

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcWin.c
# Opt level: O0

int Wlc_ManCountArithmReal(Wlc_Ntk_t *p,Vec_Int_t *vNodes)

{
  int iVar1;
  Wlc_Obj_t *pObj_00;
  undefined4 local_28;
  undefined4 local_24;
  int Counter;
  int i;
  Wlc_Obj_t *pObj;
  Vec_Int_t *vNodes_local;
  Wlc_Ntk_t *p_local;
  
  local_28 = 0;
  for (local_24 = 0; iVar1 = Vec_IntSize(vNodes), local_24 < iVar1; local_24 = local_24 + 1) {
    iVar1 = Vec_IntEntry(vNodes,local_24);
    pObj_00 = Wlc_NtkObj(p,iVar1);
    iVar1 = Wlc_ObjIsArithmReal(pObj_00);
    local_28 = iVar1 + local_28;
  }
  return local_28;
}

Assistant:

int Wlc_ManCountArithmReal( Wlc_Ntk_t * p, Vec_Int_t * vNodes )
{
    Wlc_Obj_t * pObj; 
    int i, Counter = 0;
    Wlc_NtkForEachObjVec( vNodes, p, pObj, i )
        Counter += Wlc_ObjIsArithmReal( pObj );
    return Counter;
}